

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O3

void __thiscall icu_63::UVector32::UVector32(UVector32 *this,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector32_00400120;
  this->count = 0;
  this->capacity = 0;
  this->maxCapacity = 0;
  this->elements = (int32_t *)0x0;
  _init(this,8,status);
  return;
}

Assistant:

UVector32::UVector32(UErrorCode &status) :
    count(0),
    capacity(0),
    maxCapacity(0),
    elements(NULL)
{
    _init(DEFAULT_CAPACITY, status);
}